

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::success::success(success *this,text *kind_,location *where_,text *expr_,text *note_)

{
  location *in_RCX;
  string *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  location *in_stack_ffffffffffffff18;
  string local_c0 [32];
  string local_a0 [32];
  text *in_stack_ffffffffffffff80;
  text *in_stack_ffffffffffffff88;
  location *in_stack_ffffffffffffff90;
  text *in_stack_ffffffffffffff98;
  message *in_stack_ffffffffffffffa0;
  string local_48 [72];
  
  std::__cxx11::string::string(local_48,in_RSI);
  location::location(in_RCX,in_stack_ffffffffffffff18);
  std::__cxx11::string::string(local_a0,(string *)in_RCX);
  std::__cxx11::string::string(local_c0,in_R8);
  message::message(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  location::~location((location *)0x12ee9c);
  std::__cxx11::string::~string(local_48);
  *in_RDI = &PTR__success_0013ccf8;
  return;
}

Assistant:

success( text kind_, location where_, text expr_, text note_ = "" )
    : message( kind_, where_, expr_, note_) {}